

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseData<bool>::resolve<bool>(PromiseData<bool> *this,bool *value)

{
  PromiseValue<bool> local_28;
  bool *local_18;
  bool *value_local;
  PromiseData<bool> *this_local;
  
  local_18 = value;
  value_local = (bool *)this;
  PromiseValue<bool>::PromiseValue(&local_28,value);
  PromiseValue<bool>::operator=(&this->m_value,&local_28);
  PromiseValue<bool>::~PromiseValue(&local_28);
  PromiseDataBase<bool,_void_(const_bool_&)>::setSettled
            (&this->super_PromiseDataBase<bool,_void_(const_bool_&)>);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }